

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O1

void __thiscall soplex::SSVectorBase<double>::reDim(SSVectorBase<double> *this,int newdim)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  
  lVar2 = (long)(this->super_IdxSet).num;
  if (0 < lVar2) {
    piVar1 = (this->super_IdxSet).idx;
    lVar2 = lVar2 + 1;
    do {
      if (newdim <= piVar1[lVar2 + -2]) {
        iVar3 = (this->super_IdxSet).num;
        (this->super_IdxSet).num = iVar3 + -1;
        piVar1[lVar2 + -2] = piVar1[(long)iVar3 + -1];
      }
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  VectorBase<double>::reDim(&this->super_VectorBase<double>,newdim,true);
  iVar3 = (int)((ulong)((long)(this->super_VectorBase<double>).val.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                       (long)(this->super_VectorBase<double>).val.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3) + 1;
  (this->super_IdxSet).len = iVar3;
  spx_realloc<int*>(&(this->super_IdxSet).idx,iVar3);
  return;
}

Assistant:

void reDim(int newdim)
   {
      for(int i = IdxSet::size() - 1; i >= 0; --i)
      {
         if(index(i) >= newdim)
            remove(i);
      }

      VectorBase<R>::reDim(newdim);
      setMax(VectorBase<R>::memSize() + 1);

      assert(isConsistent());
   }